

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.h
# Opt level: O2

uint32_t Ptex::v2_2::PtexUtils::ones(uint32_t x)

{
  uint uVar1;
  
  uVar1 = (x >> 1 & 0x55555555) + (x & 0x55555555);
  uVar1 = (uVar1 >> 2 & 0x33333333) + (uVar1 & 0x33333333);
  uVar1 = (uVar1 >> 4 & 0x7070707) + (uVar1 & 0x7070707);
  uVar1 = (uVar1 >> 8) + uVar1;
  return (uVar1 >> 0x10) + uVar1 & 0xff;
}

Assistant:

inline uint32_t ones(uint32_t x)
{
    // count number of ones
    x = (x & 0x55555555) + ((x >> 1) & 0x55555555); // add pairs of bits
    x = (x & 0x33333333) + ((x >> 2) & 0x33333333); // add bit pairs
    x = (x & 0x0f0f0f0f) + ((x >> 4) & 0x0f0f0f0f); // add nybbles
    x += (x >> 8);                                      // add bytes
    x += (x >> 16);                                     // add words
    return(x & 0xff);
}